

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *output_directory,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list)

{
  Params *pPVar1;
  long lVar2;
  int iVar3;
  const_iterator cVar4;
  long *plVar5;
  undefined4 extraout_var;
  FileDescriptor *pFVar7;
  undefined4 extraout_var_00;
  size_type *psVar8;
  long lVar9;
  string filename;
  Printer printer;
  value_type local_150;
  FileGenerator *local_130;
  string *local_128;
  long local_120;
  Params *local_118;
  GeneratorContext *local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108;
  string *local_100;
  char **local_f8 [2];
  char *local_e8 [15];
  EnumGenerator local_70;
  ZeroCopyOutputStream *pZVar6;
  
  pPVar1 = this->params_;
  if (pPVar1->override_java_multiple_files_ != JAVANANO_MUL_FALSE) {
    local_110 = output_directory;
    local_108 = file_list;
    local_100 = package_dir;
    if ((pPVar1->override_java_multiple_files_ != JAVANANO_MUL_TRUE) &&
       (cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&(pPVar1->java_multiple_files_)._M_t,*(key_type **)this->file_),
       (_Rb_tree_header *)cVar4._M_node ==
       &(pPVar1->java_multiple_files_)._M_t._M_impl.super__Rb_tree_header)) {
      return;
    }
    pFVar7 = this->file_;
    local_130 = this;
    if (0 < *(int *)(pFVar7 + 0x58)) {
      local_128 = &this->java_package_;
      lVar9 = 0;
      local_120 = 0;
      do {
        lVar2 = *(long *)(pFVar7 + 0x60);
        local_118 = local_130->params_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,local_100,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar2 + lVar9));
        plVar5 = (long *)std::__cxx11::string::append((char *)local_f8);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_150.field_2._M_allocated_capacity = *psVar8;
          local_150.field_2._8_8_ = plVar5[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar8;
          local_150._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_150._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0],(ulong)(local_e8[0] + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_108,&local_150);
        iVar3 = (*local_110->_vptr_GeneratorContext[2])(local_110,&local_150);
        pZVar6 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
        io::Printer::Printer((Printer *)local_f8,pZVar6,'$');
        io::Printer::Print((Printer *)local_f8,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
        if ((local_130->java_package_)._M_string_length != 0) {
          io::Printer::Print((Printer *)local_f8,"\npackage $package$;\n","package",local_128);
        }
        MessageGenerator::MessageGenerator
                  ((MessageGenerator *)&local_70,(Descriptor *)(lVar2 + lVar9),local_118);
        MessageGenerator::Generate((MessageGenerator *)&local_70,(Printer *)local_f8);
        MessageGenerator::~MessageGenerator((MessageGenerator *)&local_70);
        io::Printer::~Printer((Printer *)local_f8);
        if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
        }
        lVar2 = local_120;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        local_120 = lVar2 + 1;
        pFVar7 = local_130->file_;
        lVar9 = lVar9 + 0xa8;
      } while (local_120 < *(int *)(pFVar7 + 0x58));
    }
    if ((local_130->params_->java_enum_style_ == true) && (0 < *(int *)(pFVar7 + 0x68))) {
      local_128 = &local_130->java_package_;
      lVar9 = 0;
      local_120 = 0;
      do {
        lVar2 = *(long *)(pFVar7 + 0x70);
        local_118 = local_130->params_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,local_100,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar2 + lVar9));
        plVar5 = (long *)std::__cxx11::string::append((char *)local_f8);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_150.field_2._M_allocated_capacity = *psVar8;
          local_150.field_2._8_8_ = plVar5[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar8;
          local_150._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_150._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0],(ulong)(local_e8[0] + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_108,&local_150);
        iVar3 = (*local_110->_vptr_GeneratorContext[2])(local_110,&local_150);
        pZVar6 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3);
        io::Printer::Printer((Printer *)local_f8,pZVar6,'$');
        io::Printer::Print((Printer *)local_f8,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
        if ((local_130->java_package_)._M_string_length != 0) {
          io::Printer::Print((Printer *)local_f8,"\npackage $package$;\n","package",local_128);
        }
        EnumGenerator::EnumGenerator(&local_70,(EnumDescriptor *)(lVar2 + lVar9),local_118);
        EnumGenerator::Generate(&local_70,(Printer *)local_f8);
        EnumGenerator::~EnumGenerator(&local_70);
        io::Printer::~Printer((Printer *)local_f8);
        if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
        }
        lVar2 = local_120;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        local_120 = lVar2 + 1;
        pFVar7 = local_130->file_;
        lVar9 = lVar9 + 0x38;
      } while (local_120 < *(int *)(pFVar7 + 0x68));
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* output_directory,
                                     vector<string>* file_list) {
  if (params_.java_multiple_files(file_->name())) {
    for (int i = 0; i < file_->message_type_count(); i++) {
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        output_directory, file_list, params_);
    }

    if (params_.java_enum_style()) {
      for (int i = 0; i < file_->enum_type_count(); i++) {
        GenerateSibling<EnumGenerator>(package_dir, java_package_,
                                       file_->enum_type(i),
                                       output_directory, file_list, params_);
      }
    }
  }
}